

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_state_redistribute.cpp
# Opt level: O3

void Redistribution::StateRedistribute
               (Box *bx,int ncomp,Array4<double> *U_out,Array4<double> *U_in,
               Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *vfrac,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccent,BCRec *d_bcrec_ptr,Array4<const_int> *itracker,
               Array4<const_double> *nrs,Array4<const_double> *alpha,Array4<const_double> *nbhd_vol,
               Array4<const_double> *cent_hat,Geometry *lev_geom,int max_order)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  EBCellFlag *pEVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double *pdVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  int *piVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  undefined4 uVar35;
  int iVar36;
  int iVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  int iVar58;
  int iVar59;
  double *pdVar60;
  long lVar61;
  uint uVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  double *pdVar68;
  long lVar69;
  int iVar70;
  long lVar71;
  long lVar72;
  uint32_t *puVar73;
  undefined4 *puVar74;
  int iVar75;
  long lVar76;
  undefined4 *puVar77;
  long lVar78;
  long lVar79;
  uint uVar80;
  long lVar81;
  long lVar82;
  int iVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  int iVar87;
  ulong uVar88;
  double *pdVar89;
  long lVar90;
  int iVar91;
  long lVar92;
  double *pdVar93;
  double *pdVar94;
  int iVar95;
  long lVar96;
  bool bVar97;
  byte bVar98;
  Box result;
  Elixir eli_soln_hat;
  FArrayBox soln_hat_fab;
  double *local_798;
  int local_708;
  int iStack_704;
  int iStack_700;
  int iStack_6fc;
  Box local_658;
  long local_638;
  long local_630;
  ulong local_628;
  ulong local_620;
  ulong local_618;
  ulong local_610;
  ulong local_608;
  ulong local_600;
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  long local_5d8;
  double *local_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8;
  double *local_5b0;
  double *local_5a8;
  ulong local_5a0;
  long local_598;
  double *local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  long local_568;
  double *local_560;
  double *local_558;
  long local_550;
  long local_548;
  long local_540;
  long local_538;
  double *local_530;
  long local_528;
  Elixir local_520;
  undefined1 local_508 [712];
  Dim3 local_240;
  int iStack_234;
  int local_230;
  int iStack_22c;
  int iStack_228;
  undefined4 uStack_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int iStack_210;
  undefined8 uStack_20c;
  double *local_200;
  long lStack_1f8;
  long local_1f0;
  Long LStack_1e8;
  Dim3 local_1e0;
  int iStack_1d4;
  int iStack_1d0;
  undefined8 uStack_1cc;
  undefined4 local_1c0 [27];
  undefined4 local_154 [27];
  undefined4 local_e8 [28];
  BaseFab<double> local_78;
  
  bVar98 = 0;
  uVar1 = (lev_geom->domain).smallend.vect[0];
  local_5f0 = (ulong)uVar1;
  uVar57 = (lev_geom->domain).smallend.vect[1];
  local_600 = (ulong)uVar57;
  uVar62 = (lev_geom->domain).bigend.vect[0];
  local_5f8 = (ulong)uVar62;
  uVar2 = (lev_geom->domain).bigend.vect[1];
  local_608 = (ulong)uVar2;
  uVar80 = uVar62 + 2;
  uVar55 = uVar1 - 2;
  if ((lev_geom->super_CoordSys).field_0x51 == '\0') {
    uVar80 = uVar62;
    uVar55 = uVar1;
  }
  uVar62 = uVar2 + 2;
  uVar1 = uVar57 - 2;
  if ((lev_geom->super_CoordSys).field_0x52 == '\0') {
    uVar62 = uVar2;
    uVar1 = uVar57;
  }
  bVar97 = (lev_geom->super_CoordSys).field_0x53 == '\0';
  uVar57 = (lev_geom->domain).smallend.vect[2];
  local_618 = (ulong)uVar57;
  uVar2 = (lev_geom->domain).bigend.vect[2];
  local_610 = (ulong)uVar2;
  uVar17 = *(undefined8 *)(bx->smallend).vect;
  uVar18 = *(undefined8 *)((bx->smallend).vect + 2);
  uVar19 = *(undefined8 *)(bx->smallend).vect;
  uVar20 = *(undefined8 *)((bx->smallend).vect + 2);
  uVar21 = *(undefined8 *)((bx->bigend).vect + 2);
  iVar59 = (bx->bigend).vect[1];
  iVar91 = (bx->bigend).vect[2];
  iVar3 = (bx->smallend).vect[0];
  iVar4 = (bx->smallend).vect[1];
  iVar58 = (bx->smallend).vect[2];
  local_5e8 = (ulong)(uint)(bx->bigend).vect[0];
  local_658.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  local_658.bigend.vect[2] = (int)uVar21;
  local_658.btype.itype = (uint)((ulong)uVar21 >> 0x20);
  local_658.smallend.vect[2] = (int)uVar20;
  local_658.bigend.vect[0] = (int)((ulong)uVar20 >> 0x20);
  local_658.smallend.vect[0] = (int)uVar19;
  local_658.smallend.vect[1] = (int)((ulong)uVar19 >> 0x20);
  local_658.smallend.vect[2] = local_658.smallend.vect[2] + -3;
  local_658.bigend.vect[0] = local_658.bigend.vect[0] + 3;
  local_658.smallend.vect[1] = local_658.smallend.vect[1] + -3;
  local_658.smallend.vect[0] = local_658.smallend.vect[0] + -3;
  local_658.bigend.vect[1] = local_658.bigend.vect[1] + 3;
  local_658.bigend.vect[2] = local_658.bigend.vect[2] + 3;
  uVar56 = uVar57 - 2;
  if (bVar97) {
    uVar56 = uVar57;
  }
  uVar57 = uVar2 + 2;
  if (bVar97) {
    uVar57 = uVar2;
  }
  amrex::FArrayBox::FArrayBox((FArrayBox *)&local_78,&local_658,ncomp,true,false,(Arena *)0x0);
  if (local_78.super_DataAllocator.m_arena == (Arena *)0x0) {
    local_78.super_DataAllocator.m_arena = amrex::The_Arena();
  }
  local_620 = (ulong)(iVar58 - 1);
  local_708 = (int)uVar17;
  iStack_704 = (int)((ulong)uVar17 >> 0x20);
  iStack_700 = (int)uVar18;
  iStack_6fc = (int)((ulong)uVar18 >> 0x20);
  iVar58 = iVar91 + 1;
  iVar91 = iVar91 + 2;
  lVar84 = ((long)local_78.domain.bigend.vect[0] - (long)local_78.domain.smallend.vect[0]) + 1;
  lVar71 = (((long)local_78.domain.bigend.vect[1] + 1) - (long)local_78.domain.smallend.vect[1]) *
           lVar84;
  uVar88 = (ulong)(local_78.domain.bigend.vect[0] + 1) |
           (long)local_78.domain.bigend.vect[1] + 1 << 0x20;
  lVar92 = (((long)local_78.domain.bigend.vect[2] + 1) - (long)local_78.domain.smallend.vect[2]) *
           lVar71;
  amrex::Gpu::Elixir::Elixir(&local_520,(void *)0x0,local_78.super_DataAllocator.m_arena);
  local_508._4_4_ = 0;
  local_508._0_4_ = ncomp;
  local_508._60_4_ = (undefined4)((long)local_78.domain.bigend.vect[2] + 1);
  pdVar14 = U_in->p;
  lVar66 = U_in->jstride;
  lVar9 = U_in->kstride;
  lVar10 = U_in->nstride;
  uVar22 = (U_in->begin).x;
  uVar23 = (U_in->begin).y;
  local_508._112_4_ = (undefined4)*(undefined8 *)&(U_in->begin).z;
  local_508._124_4_ = (undefined4)*(undefined8 *)&(U_in->end).z;
  pdVar94 = vfrac->p;
  lVar11 = vfrac->jstride;
  lVar13 = vfrac->kstride;
  uVar24 = (vfrac->begin).x;
  uVar25 = (vfrac->begin).y;
  local_508._176_4_ = (undefined4)*(undefined8 *)&(vfrac->begin).z;
  pdVar26 = alpha->p;
  lVar15 = alpha->jstride;
  lVar16 = alpha->kstride;
  lVar78 = alpha->nstride;
  uVar27 = (alpha->begin).x;
  uVar28 = (alpha->begin).y;
  local_508._296_4_ = (undefined4)*(undefined8 *)&(alpha->begin).z;
  local_508._284_4_ = (undefined4)((ulong)lVar78 >> 0x20);
  piVar29 = itracker->p;
  lVar90 = itracker->jstride;
  lVar72 = itracker->kstride;
  lVar79 = itracker->nstride;
  uVar30 = (itracker->begin).x;
  uVar31 = (itracker->begin).y;
  local_508._348_4_ = (undefined4)((ulong)lVar79 >> 0x20);
  local_508._360_4_ = (undefined4)*(undefined8 *)&(itracker->begin).z;
  puVar74 = &DAT_00762b14;
  puVar77 = (undefined4 *)(local_508 + 0x180);
  for (lVar63 = 0x1b; lVar63 != 0; lVar63 = lVar63 + -1) {
    *puVar77 = *puVar74;
    puVar74 = puVar74 + (ulong)bVar98 * -2 + 1;
    puVar77 = puVar77 + (ulong)bVar98 * -2 + 1;
  }
  puVar74 = &DAT_00762b80;
  puVar77 = (undefined4 *)(local_508 + 0x1ec);
  for (lVar63 = 0x1b; lVar63 != 0; lVar63 = lVar63 + -1) {
    *puVar77 = *puVar74;
    puVar74 = puVar74 + (ulong)bVar98 * -2 + 1;
    puVar77 = puVar77 + (ulong)bVar98 * -2 + 1;
  }
  puVar74 = &DAT_00762bec;
  puVar77 = (undefined4 *)(local_508 + 600);
  for (lVar63 = 0x1b; lVar63 != 0; lVar63 = lVar63 + -1) {
    *puVar77 = *puVar74;
    puVar74 = puVar74 + (ulong)bVar98 * -2 + 1;
    puVar77 = puVar77 + (ulong)bVar98 * -2 + 1;
  }
  local_240._0_8_ = nrs->p;
  lVar63 = nrs->jstride;
  lVar32 = nrs->kstride;
  iVar33 = (nrs->begin).x;
  iVar34 = (nrs->begin).y;
  uVar17 = *(undefined8 *)&(nrs->begin).z;
  uVar35 = (nrs->end).y;
  iStack_210 = uVar35;
  uStack_20c = *(undefined8 *)&(nrs->end).z;
  local_220 = iVar33;
  local_21c = iVar34;
  local_218 = (int)uVar17;
  local_214 = (int)((ulong)uVar17 >> 0x20);
  local_230 = (int)lVar32;
  iStack_22c = (int)((ulong)lVar32 >> 0x20);
  iStack_228 = (int)nrs->nstride;
  uStack_224 = (undefined4)((ulong)nrs->nstride >> 0x20);
  local_240.z = (int)lVar63;
  iStack_234 = (int)((ulong)lVar63 >> 0x20);
  local_200 = nbhd_vol->p;
  lStack_1f8 = nbhd_vol->jstride;
  local_1f0 = nbhd_vol->kstride;
  iVar36 = (nbhd_vol->begin).x;
  iVar37 = (nbhd_vol->begin).y;
  uVar38 = (nbhd_vol->end).x;
  uVar39 = (nbhd_vol->end).y;
  LStack_1e8 = nbhd_vol->nstride;
  local_1e0.x = iVar36;
  local_1e0.y = iVar37;
  local_1e0.z = (int)*(undefined8 *)&(nbhd_vol->begin).z;
  iStack_1d4 = uVar38;
  iStack_1d0 = uVar39;
  uStack_1cc = *(undefined8 *)&(nbhd_vol->end).z;
  if (local_658.smallend.vect[2] <= local_658.bigend.vect[2]) {
    local_5a0 = (ulong)(uint)local_658.bigend.vect[0];
    local_5e0 = (ulong)(uint)local_658.bigend.vect[1];
    lVar67 = (long)local_658.smallend.vect[0];
    local_5d8 = lVar67 * 8;
    iVar70 = local_658.smallend.vect[2];
    do {
      lVar85 = (long)iVar70;
      if (local_658.smallend.vect[1] <= local_658.bigend.vect[1]) {
        local_5d0 = pdVar94 + (iVar70 - local_508._176_4_) * lVar13;
        local_798 = (double *)(long)local_658.smallend.vect[1];
        do {
          if (local_658.smallend.vect[0] <= local_658.bigend.vect[0]) {
            lVar81 = ((long)local_798 - (long)(int)uVar25) * lVar11;
            lVar96 = ((long)local_798 - (long)(int)uVar31) * lVar90;
            lVar86 = (lVar85 - (int)local_508._360_4_) * lVar72;
            local_5a8 = pdVar26 + ((long)local_798 - (long)(int)uVar28) * lVar15 +
                                  (lVar85 - (int)local_508._296_4_) * lVar16;
            pdVar64 = local_78.dptr +
                      lVar67 + ((((long)local_798 - (long)local_78.domain.smallend.vect[1]) * lVar84
                                + (lVar85 - local_78.domain.smallend.vect[2]) * lVar71) -
                               (long)local_78.domain.smallend.vect[0]);
            local_5c0 = (long)(int)uVar27;
            local_5b8 = (long)(int)uVar30;
            pdVar89 = pdVar14 + lVar67 + ((((long)local_798 - (long)(int)uVar23) * lVar66 +
                                          (lVar85 - (int)local_508._112_4_) * lVar9) -
                                         (long)(int)uVar22);
            local_5c8 = (long)iVar36;
            lVar61 = local_5d8;
            lVar82 = lVar67;
            do {
              pdVar60 = pdVar89;
              pdVar93 = pdVar64;
              pdVar68 = (double *)local_508._0_8_;
              if (0 < ncomp) {
                do {
                  *pdVar93 = *pdVar60;
                  pdVar93 = pdVar93 + lVar92;
                  pdVar60 = pdVar60 + lVar10;
                  pdVar68 = (double *)((long)pdVar68 - 1);
                } while (pdVar68 != (double *)0x0);
              }
              if ((((((0.0 < local_5d0[lVar81 + (lVar82 - (int)uVar24)]) &&
                     (local_708 + -2 <= lVar82)) && ((long)(iStack_704 + -2) <= (long)local_798)) &&
                   ((iStack_700 + -2 <= iVar70 && (lVar82 <= iStack_6fc + 2)))) &&
                  (((long)local_798 <= (long)(iVar59 + 2) &&
                   ((iVar70 <= iVar91 && ((int)uVar55 <= lVar82)))))) &&
                 (((long)(int)uVar1 <= (long)local_798 &&
                  (((((int)uVar56 <= iVar70 && (lVar82 <= (int)uVar80)) &&
                    ((long)local_798 <= (long)(int)uVar62)) && (iVar70 <= (int)uVar57)))))) {
                if (0 < ncomp) {
                  pdVar60 = pdVar89;
                  pdVar93 = pdVar64;
                  pdVar68 = (double *)local_508._0_8_;
                  do {
                    *pdVar93 = *pdVar60 * local_5a8[lVar82 - local_5c0] *
                               local_5d0[lVar81 + (lVar82 - (int)uVar24)];
                    pdVar93 = pdVar93 + lVar92;
                    pdVar60 = pdVar60 + lVar10;
                    pdVar68 = (double *)((long)pdVar68 - 1);
                  } while (pdVar68 != (double *)0x0);
                }
                uVar2 = piVar29[lVar96 + lVar86 + (lVar82 - local_5b8)];
                if (0 < (int)uVar2) {
                  local_528 = (long)(int)lVar82 - (long)(int)uVar22;
                  local_568 = (long)iVar33;
                  local_560 = (double *)
                              (lVar61 + ((long)local_798 - (long)local_78.domain.smallend.vect[1]) *
                                        lVar84 * 8 +
                               (lVar85 - local_78.domain.smallend.vect[2]) * lVar71 * 8 +
                               (long)local_78.domain.smallend.vect[0] * -8 + (long)local_78.dptr);
                  local_550 = lVar9 * 8;
                  local_548 = -(long)(int)local_508._112_4_;
                  local_540 = lVar66 * 8;
                  local_538 = -(long)(int)uVar23;
                  local_570 = (long)iVar34;
                  local_580 = (long)local_218;
                  lVar69 = 1;
                  do {
                    lVar65 = (long)piVar29[lVar96 + lVar86 + (lVar82 - local_5b8) + lVar69 * lVar79]
                    ;
                    lVar76 = (long)(int)lVar82 + (long)*(int *)(local_508 + lVar65 * 4 + 0x180);
                    iVar75 = (int)lVar76;
                    if ((int)uVar55 <= iVar75) {
                      iVar95 = *(int *)(local_508 + lVar65 * 4 + 0x1ec) + (int)local_798;
                      if (((int)uVar1 <= iVar95) && (0 < ncomp)) {
                        iVar87 = *(int *)(local_508 + lVar65 * 4 + 600) + iVar70;
                        if ((((int)uVar56 <= iVar87) &&
                            ((iVar75 <= (int)uVar80 && (iVar95 <= (int)uVar62)))) &&
                           (iVar87 <= (int)uVar57)) {
                          pdVar68 = (double *)
                                    (((*(int *)(local_508 + lVar65 * 4 + 0x1ec) + (int)local_798) +
                                     local_538) * local_540 +
                                     ((*(int *)(local_508 + lVar65 * 4 + 600) + iVar70) + local_548)
                                     * local_550 +
                                     (*(int *)(local_508 + lVar65 * 4 + 0x180) + local_528) * 8 +
                                    (long)pdVar14);
                          pdVar60 = local_560;
                          pdVar93 = (double *)local_508._0_8_;
                          do {
                            *pdVar60 = (*pdVar68 *
                                        pdVar26[((long)local_798 - (long)(int)uVar28) * lVar15 +
                                                (lVar82 - (int)uVar27) +
                                                (lVar85 - (int)local_508._296_4_) * lVar16 + lVar78]
                                       * pdVar94[(iVar95 - uVar25) * lVar11 +
                                                 (long)(iVar75 - uVar24) +
                                                 (iVar87 - local_508._176_4_) * lVar13]) /
                                       *(double *)
                                        (local_240._0_8_ +
                                        ((iVar95 - local_570) * lVar63 +
                                        (lVar76 - local_568) + (iVar87 - local_580) * lVar32) * 8) +
                                       *pdVar60;
                            pdVar60 = pdVar60 + lVar92;
                            pdVar68 = pdVar68 + lVar10;
                            pdVar93 = (double *)((long)pdVar93 - 1);
                          } while (pdVar93 != (double *)0x0);
                        }
                      }
                    }
                    lVar69 = lVar69 + 1;
                    local_588 = lVar32;
                    local_578 = lVar63;
                    local_558 = (double *)local_240._0_8_;
                    local_530 = pdVar14;
                  } while (lVar69 != (ulong)uVar2 + 1);
                }
                local_5b0 = pdVar89;
                if (0 < ncomp) {
                  pdVar60 = pdVar64;
                  pdVar93 = (double *)local_508._0_8_;
                  do {
                    *pdVar60 = *pdVar60 /
                               local_200[((long)local_798 - (long)iVar37) * lStack_1f8 +
                                         (lVar85 - local_1e0.z) * local_1f0 + (lVar82 - local_5c8)];
                    pdVar60 = pdVar60 + lVar92;
                    pdVar93 = (double *)((long)pdVar93 - 1);
                  } while (pdVar93 != (double *)0x0);
                }
              }
              lVar82 = lVar82 + 1;
              pdVar64 = pdVar64 + 1;
              pdVar89 = pdVar89 + 1;
              lVar61 = lVar61 + 8;
            } while (local_658.bigend.vect[0] + 1U != (int)lVar82);
          }
          local_798 = (double *)((long)local_798 + 1);
          local_598 = lVar13;
          local_590 = pdVar94;
        } while (local_658.bigend.vect[1] + 1U != (int)local_798);
      }
      bVar97 = iVar70 != local_658.bigend.vect[2];
      iVar70 = iVar70 + 1;
    } while (bVar97);
  }
  local_508._0_8_ = vfrac->p;
  local_508._8_8_ = vfrac->jstride;
  local_508._16_8_ = vfrac->kstride;
  local_508._24_8_ = vfrac->nstride;
  local_508._32_4_ = (vfrac->begin).x;
  local_508._36_4_ = (vfrac->begin).y;
  uVar17 = *(undefined8 *)&(vfrac->begin).z;
  uVar40 = (vfrac->end).y;
  local_508._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_508._40_4_ = (undefined4)uVar17;
  local_508._44_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._64_8_ = itracker->p;
  local_508._72_8_ = itracker->jstride;
  local_508._80_8_ = itracker->kstride;
  local_508._88_8_ = itracker->nstride;
  local_508._96_4_ = (itracker->begin).x;
  local_508._100_4_ = (itracker->begin).y;
  uVar41 = (itracker->end).x;
  uVar42 = (itracker->end).y;
  uVar17 = *(undefined8 *)&(itracker->end).z;
  local_508._104_4_ = (undefined4)*(undefined8 *)&(itracker->begin).z;
  local_508._116_4_ = (undefined4)uVar17;
  local_508._120_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  uVar17 = *(undefined8 *)(bx->smallend).vect;
  uVar18 = *(undefined8 *)(bx->bigend).vect;
  uVar19 = *(undefined8 *)((bx->bigend).vect + 2);
  local_508._128_4_ = (undefined4)uVar17;
  local_508._132_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._136_4_ = (undefined4)*(undefined8 *)((bx->smallend).vect + 2);
  local_508._140_4_ = (undefined4)uVar18;
  local_508._144_4_ = (undefined4)((ulong)uVar18 >> 0x20);
  local_508._148_4_ = (undefined4)uVar19;
  local_508._152_4_ = (undefined4)((ulong)uVar19 >> 0x20);
  local_508._160_8_ = U_out->p;
  local_508._168_8_ = U_out->jstride;
  uVar43 = (U_out->begin).x;
  uVar44 = (U_out->begin).y;
  uVar17 = *(undefined8 *)&(U_out->begin).z;
  uVar45 = (U_out->end).y;
  uVar18 = *(undefined8 *)&(U_out->end).z;
  local_508._212_4_ = (undefined4)uVar18;
  local_508._216_4_ = (undefined4)((ulong)uVar18 >> 0x20);
  local_508._200_4_ = (undefined4)uVar17;
  local_508._204_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._176_4_ = (undefined4)U_out->kstride;
  local_508._180_4_ = (undefined4)((ulong)U_out->kstride >> 0x20);
  local_508._184_4_ = (undefined4)U_out->nstride;
  local_508._188_4_ = (undefined4)((ulong)U_out->nstride >> 0x20);
  local_508._224_8_ = alpha->p;
  local_508._232_8_ = alpha->jstride;
  local_508._240_8_ = alpha->kstride;
  local_508._248_8_ = alpha->nstride;
  local_508._256_4_ = (alpha->begin).x;
  local_508._260_4_ = (alpha->begin).y;
  uVar17 = *(undefined8 *)&(alpha->begin).z;
  uVar46 = (alpha->end).y;
  uVar18 = *(undefined8 *)&(alpha->end).z;
  local_508._276_4_ = (undefined4)uVar18;
  local_508._280_4_ = (undefined4)((ulong)uVar18 >> 0x20);
  local_508._264_4_ = (undefined4)uVar17;
  local_508._268_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._288_8_ = nrs->p;
  local_508._320_4_ = (nrs->begin).x;
  local_508._324_4_ = (nrs->begin).y;
  uVar47 = (nrs->end).x;
  uVar48 = (nrs->end).y;
  uVar17 = *(undefined8 *)&(nrs->end).z;
  local_508._296_4_ = (undefined4)nrs->jstride;
  local_508._300_4_ = (undefined4)((ulong)nrs->jstride >> 0x20);
  local_508._304_4_ = (undefined4)nrs->kstride;
  local_508._308_4_ = (undefined4)((ulong)nrs->kstride >> 0x20);
  local_508._312_4_ = (undefined4)nrs->nstride;
  local_508._316_4_ = (undefined4)((ulong)nrs->nstride >> 0x20);
  local_508._328_4_ = (undefined4)*(undefined8 *)&(nrs->begin).z;
  local_508._340_4_ = (undefined4)uVar17;
  local_508._344_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._352_8_ = local_78.dptr;
  local_508._416_8_ = d_bcrec_ptr;
  local_508._424_8_ = flag->p;
  local_508._432_8_ = flag->jstride;
  local_508._440_8_ = flag->kstride;
  local_508._448_8_ = flag->nstride;
  local_508._456_4_ = (flag->begin).x;
  local_508._460_4_ = (flag->begin).y;
  uVar17 = *(undefined8 *)&(flag->begin).z;
  uVar49 = (flag->end).y;
  local_508._476_8_ = *(undefined8 *)&(flag->end).z;
  local_508._464_4_ = (undefined4)uVar17;
  local_508._468_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._488_8_ = cent_hat->p;
  local_508._496_8_ = cent_hat->jstride;
  local_508._504_8_ = cent_hat->kstride;
  local_508._512_8_ = cent_hat->nstride;
  local_508._520_4_ = (cent_hat->begin).x;
  local_508._524_4_ = (cent_hat->begin).y;
  uVar17 = *(undefined8 *)&(cent_hat->begin).z;
  uVar50 = (cent_hat->end).y;
  local_508._540_8_ = *(undefined8 *)&(cent_hat->end).z;
  local_508._528_4_ = (undefined4)uVar17;
  local_508._532_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._552_8_ = fcx->p;
  local_508._560_8_ = fcx->jstride;
  local_508._568_8_ = fcx->kstride;
  local_508._576_8_ = fcx->nstride;
  local_508._584_4_ = (fcx->begin).x;
  local_508._588_4_ = (fcx->begin).y;
  uVar17 = *(undefined8 *)&(fcx->begin).z;
  uVar51 = (fcx->end).y;
  local_508._604_8_ = *(undefined8 *)&(fcx->end).z;
  local_508._592_4_ = (undefined4)uVar17;
  local_508._596_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._616_8_ = fcy->p;
  local_508._624_8_ = fcy->jstride;
  local_508._632_8_ = fcy->kstride;
  local_508._640_8_ = fcy->nstride;
  local_508._648_4_ = (fcy->begin).x;
  local_508._652_4_ = (fcy->begin).y;
  uVar17 = *(undefined8 *)&(fcy->begin).z;
  uVar52 = (fcy->end).y;
  local_508._668_8_ = *(undefined8 *)&(fcy->end).z;
  local_508._656_4_ = (undefined4)uVar17;
  local_508._660_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  local_508._680_8_ = fcz->p;
  local_508._688_8_ = fcz->jstride;
  local_508._696_8_ = fcz->kstride;
  local_508._704_8_ = fcz->nstride;
  local_240.x = (fcz->begin).x;
  local_240.y = (fcz->begin).y;
  uVar17 = *(undefined8 *)&(fcz->begin).z;
  uVar53 = (fcz->end).y;
  uVar18 = *(undefined8 *)&(fcz->end).z;
  iStack_22c = (int)uVar18;
  iStack_228 = (int)((ulong)uVar18 >> 0x20);
  local_240.z = (int)uVar17;
  iStack_234 = (int)((ulong)uVar17 >> 0x20);
  local_21c = (int)local_600;
  local_220 = (int)local_5f0;
  local_218 = (int)local_618;
  local_214 = (int)local_5f8;
  iStack_210 = (int)local_608;
  uStack_20c._4_4_ = max_order;
  uStack_20c._0_4_ = (int)local_610;
  local_200 = ccent->p;
  lStack_1f8 = ccent->jstride;
  local_1f0 = ccent->kstride;
  LStack_1e8 = ccent->nstride;
  local_1e0.x = (ccent->begin).x;
  local_1e0.y = (ccent->begin).y;
  uVar17 = *(undefined8 *)&(ccent->begin).z;
  uVar54 = (ccent->end).y;
  uStack_1cc = *(undefined8 *)&(ccent->end).z;
  local_1e0.z = (int)uVar17;
  iStack_1d4 = (int)((ulong)uVar17 >> 0x20);
  puVar74 = &DAT_00762b14;
  puVar77 = (undefined4 *)(local_508 + 0x348);
  for (lVar66 = 0x1b; lVar66 != 0; lVar66 = lVar66 + -1) {
    *puVar77 = *puVar74;
    puVar74 = puVar74 + (ulong)bVar98 * -2 + 1;
    puVar77 = puVar77 + (ulong)bVar98 * -2 + 1;
  }
  puVar74 = &DAT_00762b80;
  puVar77 = (undefined4 *)(local_508 + 0x3b4);
  for (lVar66 = 0x1b; lVar66 != 0; lVar66 = lVar66 + -1) {
    *puVar77 = *puVar74;
    puVar74 = puVar74 + (ulong)bVar98 * -2 + 1;
    puVar77 = puVar77 + (ulong)bVar98 * -2 + 1;
  }
  puVar74 = &DAT_00762bec;
  puVar77 = (undefined4 *)(local_508 + 0x420);
  for (lVar66 = 0x1b; lVar66 != 0; lVar66 = lVar66 + -1) {
    *puVar77 = *puVar74;
    puVar74 = puVar74 + (ulong)bVar98 * -2 + 1;
    puVar77 = puVar77 + (ulong)bVar98 * -2 + 1;
  }
  local_638 = lVar92;
  local_630 = lVar84;
  local_628 = uVar88;
  local_508._48_4_ = uVar40;
  local_508._108_4_ = uVar41;
  local_508._112_4_ = uVar42;
  local_508._156_4_ = ncomp;
  local_508._192_4_ = uVar43;
  local_508._196_4_ = uVar44;
  local_508._208_4_ = uVar45;
  local_508._220_4_ = iVar91;
  local_508._272_4_ = uVar46;
  local_508._332_4_ = uVar47;
  local_508._336_4_ = uVar48;
  local_508._396_8_ = uVar88;
  local_508._404_4_ = local_508._60_4_;
  local_508._472_4_ = uVar49;
  local_508._536_4_ = uVar50;
  local_508._600_4_ = uVar51;
  local_508._664_4_ = uVar52;
  local_230 = uVar53;
  iStack_1d0 = uVar54;
  if ((int)local_620 <= iVar58) {
    iVar3 = iVar3 + -1;
    iVar4 = iVar4 + -1;
    iVar91 = (int)local_5e8;
    iVar59 = iVar59 + 1;
    uVar88 = local_620;
    do {
      iVar75 = (int)uVar88;
      iVar70 = iVar4;
      if (iVar4 <= iVar59) {
        do {
          iVar95 = iVar3;
          local_508._360_8_ = lVar84;
          local_508._376_8_ = lVar92;
          local_508._368_8_ = lVar71;
          if (iVar3 <= iVar91 + 1) {
            do {
              StateRedistribute::anon_class_1168_25_229d2891::operator()
                        ((anon_class_1168_25_229d2891 *)local_508,iVar95,iVar70,iVar75);
              iVar87 = iVar95 - iVar91;
              iVar95 = iVar95 + 1;
              lVar84 = local_508._360_8_;
              lVar92 = local_508._376_8_;
              lVar71 = local_508._368_8_;
            } while (iVar87 != 1);
          }
          bVar97 = iVar70 != iVar59;
          iVar70 = iVar70 + 1;
        } while (bVar97);
      }
      uVar88 = (ulong)(iVar75 + 1);
    } while (iVar75 != iVar58);
  }
  if (0 < ncomp) {
    lVar66 = flag->jstride;
    lVar9 = flag->kstride;
    lVar10 = nrs->jstride;
    lVar11 = U_out->jstride;
    iVar3 = (nrs->begin).y;
    iVar4 = (bx->smallend).vect[1];
    lVar90 = (long)iVar4;
    iVar59 = (bx->smallend).vect[0];
    lVar78 = (long)iVar59;
    iVar91 = (nrs->begin).x;
    iVar58 = (flag->begin).y;
    iVar70 = (flag->begin).x;
    iVar75 = (flag->begin).z;
    pEVar12 = flag->p;
    lVar13 = nrs->kstride;
    pdVar14 = nrs->p;
    iVar95 = (nrs->begin).z;
    local_798 = U_out->p +
                (((lVar90 - (U_out->begin).y) * lVar11 + lVar78) - (long)(U_out->begin).x);
    lVar15 = U_out->kstride;
    lVar16 = U_out->nstride;
    iVar87 = (U_out->begin).z;
    iVar5 = (bx->smallend).vect[2];
    iVar6 = (bx->bigend).vect[2];
    iVar7 = (bx->bigend).vect[0];
    iVar8 = (bx->bigend).vect[1];
    uVar88 = 0;
    do {
      iVar83 = iVar5;
      if (iVar5 <= iVar6) {
        do {
          if (iVar4 <= iVar8) {
            lVar72 = (long)iVar83;
            pdVar94 = (double *)((lVar72 - iVar87) * lVar15 * 8 + (long)local_798);
            lVar79 = (long)pdVar14 +
                     (lVar72 - iVar95) * lVar13 * 8 +
                     lVar78 * 8 + (lVar90 - iVar3) * lVar10 * 8 + (long)iVar91 * -8;
            puVar73 = (uint32_t *)
                      ((long)&pEVar12[((lVar90 - iVar58) * lVar66 + lVar78) - (long)iVar70].flag +
                      (lVar72 - iVar75) * lVar9 * 4);
            lVar72 = lVar90;
            do {
              if (iVar59 <= iVar7) {
                lVar63 = 0;
                do {
                  if ((~puVar73[lVar63] & 3) == 0) {
                    pdVar94[lVar63] = 1e+40;
                  }
                  else {
                    pdVar94[lVar63] =
                         (1.0 / (*(double *)(lVar79 + lVar63 * 8) + 1e-40)) * pdVar94[lVar63];
                  }
                  lVar63 = lVar63 + 1;
                } while ((iVar7 - iVar59) + 1 != (int)lVar63);
              }
              lVar72 = lVar72 + 1;
              pdVar94 = pdVar94 + lVar11;
              lVar79 = lVar79 + lVar10 * 8;
              puVar73 = puVar73 + lVar66;
            } while (iVar8 + 1 != (int)lVar72);
          }
          bVar97 = iVar83 != iVar6;
          iVar83 = iVar83 + 1;
        } while (bVar97);
      }
      uVar88 = uVar88 + 1;
      local_798 = local_798 + lVar16;
    } while (uVar88 != (uint)ncomp);
  }
  local_508._360_8_ = lVar84;
  local_508._376_8_ = lVar92;
  local_508._368_8_ = lVar71;
  amrex::Gpu::Elixir::~Elixir(&local_520);
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  amrex::BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
Redistribution::StateRedistribute ( Box const& bx, int ncomp,
                                    Array4<Real> const& U_out,
                                    Array4<Real> const& U_in,
                                    Array4<EBCellFlag const> const& flag,
                                    Array4<Real const> const& vfrac,
                                    AMREX_D_DECL(Array4<Real const> const& fcx,
                                                 Array4<Real const> const& fcy,
                                                 Array4<Real const> const& fcz),
                                    Array4<Real const> const& ccent,
                                    amrex::BCRec  const* d_bcrec_ptr,
                                    Array4< int const> const& itracker,
                                    Array4<Real const> const& nrs,
                                    Array4<Real const> const& alpha,
                                    Array4<Real const> const& nbhd_vol,
                                    Array4<Real const> const& cent_hat,
                                    Geometry const& lev_geom,
                                    const int max_order)
{
    // Note that itracker has {4 in 2D, 8 in 3D} components and all are initialized to zero
    // We will add to the first component every time this cell is included in a merged neighborhood,
    //    either by merging or being merged
    //
    // In 2D, we identify the cells in the remaining three components with the following ordering
    //
    // ^  6 7 8
    // |  4   5
    // j  1 2 3
    //   i --->
    //
    // In 3D, We identify the cells in the remaining three components with the following ordering
    //
    //    at k-1   |   at k  |   at k+1
    //
    // ^  15 16 17 |  6 7 8  |  24 25 26
    // |  12 13 14 |  4   5  |  21 22 23
    // j  9  10 11 |  1 2 3  |  18 19 20
    //   i --->
    //
    // Note the first component of each of these arrays should never be used
    //
#if (AMREX_SPACEDIM == 2)
    amrex::GpuArray<int,9> imap{0,-1, 0, 1,-1, 1,-1, 0, 1};
    amrex::GpuArray<int,9> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1};
    amrex::GpuArray<int,9> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0};
#else
    amrex::GpuArray<int,27> imap{0,-1, 0, 1,-1, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1};
    amrex::GpuArray<int,27> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1};
    amrex::GpuArray<int,27> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0,-1,-1,-1,-1,-1,-1,-1,-1,-1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
#endif

    const Box domain = lev_geom.Domain();
    const int domain_ilo = domain.smallEnd(0);
    const int domain_ihi = domain.bigEnd(0);
    const int domain_jlo = domain.smallEnd(1);
    const int domain_jhi = domain.bigEnd(1);
#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain.smallEnd(2);
    const int domain_khi = domain.bigEnd(2);
#endif

    AMREX_D_TERM(const auto& is_periodic_x = lev_geom.isPeriodic(0);,
                 const auto& is_periodic_y = lev_geom.isPeriodic(1);,
                 const auto& is_periodic_z = lev_geom.isPeriodic(2););

    // amrex::Print() << " IN STATE_REDISTRIBUTE DOING BOX " << bx << " with ncomp " << ncomp << std::endl;
    // amrex::Print() << " Box(U_in) " << Box(U_in) << std::endl;
    // amrex::Print() << " Box(U_out) " << Box(U_out) << std::endl;

    Box const& bxg1 = amrex::grow(bx,1);
    Box const& bxg2 = amrex::grow(bx,2);
    Box const& bxg3 = amrex::grow(bx,3);

    Box domain_per_grown = domain;
    if (is_periodic_x) domain_per_grown.grow(0,2);
    if (is_periodic_y) domain_per_grown.grow(1,2);
#if (AMREX_SPACEDIM == 3)
    if (is_periodic_z) domain_per_grown.grow(2,2);
#endif

    // Solution at the centroid of my nbhd
    FArrayBox    soln_hat_fab (bxg3,ncomp);
    Array4<Real> soln_hat = soln_hat_fab.array();
    Elixir   eli_soln_hat = soln_hat_fab.elixir();

    // Define Qhat (from Berger and Guliani)
    // Here we initialize soln_hat to equal U_in on all cells in bxg3 so that
    //      in the event we need to use soln_hat 3 cells out from the bx limits
    //      in a modified slope computation, we have a value of soln_hat to use.
    //      But we only modify soln_hat inside bxg2
    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        for (int n = 0; n < ncomp; n++)
            soln_hat(i,j,k,n) = U_in(i,j,k,n);

        if (vfrac(i,j,k) > 0.0 && bxg2.contains(IntVect(AMREX_D_DECL(i,j,k)))
                               && domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k)))) {

            // Start with U_in(i,j,k) itself
            for (int n = 0; n < ncomp; n++)
                soln_hat(i,j,k,n) = U_in(i,j,k,n) * alpha(i,j,k,0) * vfrac(i,j,k);

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];

                if (domain_per_grown.contains(IntVect(AMREX_D_DECL(r,s,t))))
                {
                    for (int n = 0; n < ncomp; n++)
                        soln_hat(i,j,k,n) += U_in(r,s,t,n) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);
                }
            }
            for (int n = 0; n < ncomp; n++)
                soln_hat(i,j,k,n) /= nbhd_vol(i,j,k);
        }
    });

    amrex::ParallelFor(bxg1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (vfrac(i,j,k) > 0.0)
        {
            int num_nbors = itracker(i,j,k,0);

            if (itracker(i,j,k,0) == 0)
            {
                if (bx.contains(IntVect(AMREX_D_DECL(i,j,k))))
                {
                    for (int n = 0; n < ncomp; n++)
                        amrex::Gpu::Atomic::Add(&U_out(i,j,k,n),alpha(i,j,k,0)*nrs(i,j,k)*soln_hat(i,j,k,n));
                }

            } else {

                for (int n = 0; n < ncomp; n++)
                {
                    bool extdir_ilo = (d_bcrec_ptr[n].lo(0) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(0) == amrex::BCType::hoextrap);
                    bool extdir_ihi = (d_bcrec_ptr[n].hi(0) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(0) == amrex::BCType::hoextrap);
                    bool extdir_jlo = (d_bcrec_ptr[n].lo(1) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(1) == amrex::BCType::hoextrap);
                    bool extdir_jhi = (d_bcrec_ptr[n].hi(1) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(1) == amrex::BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                    bool extdir_klo = (d_bcrec_ptr[n].lo(2) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].lo(2) == amrex::BCType::hoextrap);
                    bool extdir_khi = (d_bcrec_ptr[n].hi(2) == amrex::BCType::ext_dir ||
                                       d_bcrec_ptr[n].hi(2) == amrex::BCType::hoextrap);
#endif
                    // Initialize so that the slope stencil goes from -1:1 in each diretion
                    int nx = 1; int ny = 1; int nz = 1;

                    // Do we have enough extent in each coordinate direction to use the 3x3x3 stencil
                    //    or do we need to enlarge it?
                    AMREX_D_TERM(Real x_max = -1.e30; Real x_min = 1.e30;,
                                 Real y_max = -1.e30; Real y_min = 1.e30;,
                                 Real z_max = -1.e30; Real z_min = 1.e30;);

                    Real slope_stencil_min_width = 0.5;
#if (AMREX_SPACEDIM == 2)
                    int kk = 0;
#elif (AMREX_SPACEDIM == 3)
                    for(int kk(-1); kk<=1; kk++)
#endif
                    {
                     for(int jj(-1); jj<=1; jj++)
                      for(int ii(-1); ii<=1; ii++)
                        if (flag(i,j,k).isConnected(ii,jj,kk))
                        {
                            int r = i+ii; int s = j+jj; int t = k+kk;

                            x_max = amrex::max(x_max, cent_hat(r,s,t,0)+static_cast<Real>(ii));
                            x_min = amrex::min(x_min, cent_hat(r,s,t,0)+static_cast<Real>(ii));
                            y_max = amrex::max(y_max, cent_hat(r,s,t,1)+static_cast<Real>(jj));
                            y_min = amrex::min(y_min, cent_hat(r,s,t,1)+static_cast<Real>(jj));
#if (AMREX_SPACEDIM == 3)
                            z_max = amrex::max(z_max, cent_hat(r,s,t,2)+static_cast<Real>(kk));
                            z_min = amrex::min(z_min, cent_hat(r,s,t,2)+static_cast<Real>(kk));
#endif
                        }
                    }
                    // If we need to grow the stencil, we let it be -nx:nx in the x-direction,
                    //    for example.   Note that nx,ny,nz are either 1 or 2
                    if ( (x_max-x_min) < slope_stencil_min_width ) nx = 2;
                    if ( (y_max-y_min) < slope_stencil_min_width ) ny = 2;
#if (AMREX_SPACEDIM == 3)
                    if ( (z_max-z_min) < slope_stencil_min_width ) nz = 2;
#endif

                    amrex::GpuArray<amrex::Real,AMREX_SPACEDIM> slopes_eb;
                    if (nx*ny*nz == 1)
                        // Compute slope using 3x3x3 stencil
                        slopes_eb = amrex_calc_slopes_extdir_eb(
                                                    i,j,k,n,soln_hat,cent_hat,vfrac,
                                                    AMREX_D_DECL(fcx,fcy,fcz),flag,
                                                    AMREX_D_DECL(extdir_ilo, extdir_jlo, extdir_klo),
                                                    AMREX_D_DECL(extdir_ihi, extdir_jhi, extdir_khi),
                                                    AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                                    AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                                    max_order);
                    else
                    {
                        // Compute slope using grown stencil (no larger than 5x5x5)
                        slopes_eb = amrex_calc_slopes_extdir_eb_grown(
                                                    i,j,k,n,AMREX_D_DECL(nx,ny,nz),
                                                    soln_hat,cent_hat,vfrac,
                                                    AMREX_D_DECL(fcx,fcy,fcz),flag,
                                                    AMREX_D_DECL(extdir_ilo, extdir_jlo, extdir_klo),
                                                    AMREX_D_DECL(extdir_ihi, extdir_jhi, extdir_khi),
                                                    AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                                    AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                                    max_order);
                    }

                    // We do the limiting separately because this limiter limits the slope based on the values
                    //    extrapolated to the cell centroid (cent_hat) locations - unlike the limiter in amrex
                    //    which bases the limiting on values extrapolated to the face centroids.
                    amrex::GpuArray<amrex::Real,AMREX_SPACEDIM> lim_slope =
                        amrex_calc_centroid_limiter(i,j,k,n,soln_hat,flag,slopes_eb,cent_hat);

                    AMREX_D_TERM(lim_slope[0] *= slopes_eb[0];,
                                 lim_slope[1] *= slopes_eb[1];,
                                 lim_slope[2] *= slopes_eb[2];);

                    // Add to the cell itself
                    if (bx.contains(IntVect(AMREX_D_DECL(i,j,k))))
                    {
                        Real update = soln_hat(i,j,k,n);
                        AMREX_D_TERM(update += lim_slope[0] * (ccent(i,j,k,0)-cent_hat(i,j,k,0));,
                                     update += lim_slope[1] * (ccent(i,j,k,1)-cent_hat(i,j,k,1));,
                                     update += lim_slope[2] * (ccent(i,j,k,2)-cent_hat(i,j,k,2)););
                        amrex::Gpu::Atomic::Add(&U_out(i,j,k,n),alpha(i,j,k,0)*nrs(i,j,k)*update);
                    } // if bx contains

                    // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
                    for (int i_nbor = 1; i_nbor <= num_nbors; i_nbor++)
                    {
                        int r = i+imap[itracker(i,j,k,i_nbor)];
                        int s = j+jmap[itracker(i,j,k,i_nbor)];
                        int t = k+kmap[itracker(i,j,k,i_nbor)];

                        if (bx.contains(IntVect(AMREX_D_DECL(r,s,t))))
                        {
                            Real update = soln_hat(i,j,k,n);
                            AMREX_D_TERM(update += lim_slope[0] * (ccent(r,s,t,0)-cent_hat(i,j,k,0) + static_cast<Real>(r-i));,
                                         update += lim_slope[1] * (ccent(r,s,t,1)-cent_hat(i,j,k,1) + static_cast<Real>(s-j));,
                                         update += lim_slope[2] * (ccent(r,s,t,2)-cent_hat(i,j,k,2) + static_cast<Real>(t-k)););
                            amrex::Gpu::Atomic::Add(&U_out(r,s,t,n),alpha(i,j,k,1)*update);
                        } // if bx contains
                    } // i_nbor
                } // n
            } // num_nbors
        } // vfrac
    });

    amrex::ParallelFor(bx,ncomp,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // This seems to help with a compiler issue ...
            Real denom = 1. / (nrs(i,j,k) + 1.e-40);
            U_out(i,j,k,n) *= denom;
        }
        else
        {
            U_out(i,j,k,n) = 1.e40;
        }
    });

#if 0
    //
    // This tests whether the redistribution procedure was conservative --
    //      only use if bx is the whole domain
    //
    {
      for (int n = 0; n < ncomp; n++)
      {
        Real sum1(0);
        Real sum2(0);
#if (AMREX_SPACEDIM == 2)
        int k = 0;
#else
        for (int k = bx.smallEnd(2); k <= domain.bigEnd(2); k++)
#endif
        for (int j = bx.smallEnd(1); j <= domain.bigEnd(1); j++)
        for (int i = bx.smallEnd(0); i <= domain.bigEnd(0); i++)
        {
            sum1 += vfrac(i,j,k)*U_in(i,j,k,n);
            sum2 += vfrac(i,j,k)*U_out(i,j,k,n);
        }
        if (std::abs(sum1-sum2) > 1.e-8 * sum1 && std::abs(sum1-sum2) > 1.e-8)
        {
           printf("SUMS DO NOT MATCH IN STATE REDIST : %f %f ",sum1,sum2);
           amrex::Abort();
        }
      }
    }
#endif
}